

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  ImDrawList *draw_list;
  uint uVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  char *pcVar7;
  undefined1 uVar8;
  bool bVar9;
  ImU32 id;
  uint uVar10;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar11;
  size_t sVar12;
  undefined8 extraout_RAX;
  char *pcVar13;
  int iVar14;
  int iVar15;
  uint flags_00;
  int iVar16;
  int iVar17;
  ImGuiCol idx;
  bool *pbVar18;
  long lVar19;
  ImGuiTabItem *pIVar20;
  undefined4 uVar21;
  undefined7 uVar23;
  undefined8 uVar22;
  bool bVar24;
  float fVar25;
  ImVec2 IVar26;
  bool text_clipped;
  bool just_closed;
  ImGuiContext *local_c0;
  ImRect bb;
  bool local_a8;
  bool held;
  float local_84;
  ImGuiWindow *local_80;
  bool hovered;
  float fStack_74;
  uint local_70;
  int local_6c;
  ImVec2 local_68;
  char *local_60;
  undefined8 local_58;
  uint local_4c;
  float local_48;
  float fStack_44;
  bool *local_38;
  
  pIVar5 = GImGui;
  if (tab_bar->WantLayout == true) {
    uVar21 = *(undefined4 *)&(GImGui->NextItemData).OpenVal;
    bb.Min.x = (float)(GImGui->NextItemData).Flags;
    bb.Min.y = (GImGui->NextItemData).Width;
    bb.Max.x = (float)(GImGui->NextItemData).FocusScopeId;
    bb.Max.y = (float)(GImGui->NextItemData).OpenCond;
    TabBarLayout(tab_bar);
    local_a8 = SUB41(uVar21,0);
    (pIVar5->NextItemData).OpenVal = local_a8;
    (pIVar5->NextItemData).Flags = (ImGuiNextItemDataFlags)bb.Min.x;
    (pIVar5->NextItemData).Width = bb.Min.y;
    (pIVar5->NextItemData).FocusScopeId = (ImGuiID)bb.Max.x;
    (pIVar5->NextItemData).OpenCond = (ImGuiCond)bb.Max.y;
  }
  local_80 = pIVar5->CurrentWindow;
  if (local_80->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,8);
    return false;
  }
  local_c0 = pIVar5;
  bVar24 = ((uint)flags >> 0x14 & 1) != 0;
  flags_00 = flags | 0x100000;
  if (bVar24) {
    flags_00 = flags;
  }
  pbVar18 = (bool *)0x0;
  if (!bVar24) {
    pbVar18 = p_open;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  uVar10 = (tab_bar->Tabs).Size;
  local_60 = label;
  if (0 < (int)uVar10 && id != 0) {
    pIVar11 = (tab_bar->Tabs).Data;
    lVar19 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar11->ID + lVar19) == id) {
        pIVar20 = (ImGuiTabItem *)((long)&pIVar11->ID + lVar19);
        uVar21 = 0;
        goto LAB_002247ac;
      }
      lVar19 = lVar19 + 0x2c;
    } while ((ulong)uVar10 * 0x2c - lVar19 != 0);
  }
  _hovered = 0.0;
  fStack_74 = 0.0;
  bb.Min.x = 0.0;
  bb.Min.y = 0.0;
  bb.Max = (ImVec2)((ulong)bb.Max & 0xffffffff00000000);
  _held = 0.0;
  if (uVar10 == (tab_bar->Tabs).Capacity) {
    if (uVar10 == 0) {
      iVar14 = 8;
    }
    else {
      iVar14 = (int)uVar10 / 2 + uVar10;
    }
    iVar16 = uVar10 + 1;
    if ((int)(uVar10 + 1) < iVar14) {
      iVar16 = iVar14;
    }
    pIVar11 = (ImGuiTabItem *)MemAlloc((long)iVar16 * 0x2c);
    pIVar20 = (tab_bar->Tabs).Data;
    if (pIVar20 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar11,pIVar20,(long)(tab_bar->Tabs).Size * 0x2c);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar11;
    (tab_bar->Tabs).Capacity = iVar16;
    uVar10 = (tab_bar->Tabs).Size;
    p_open = pbVar18;
  }
  else {
    pIVar11 = (tab_bar->Tabs).Data;
  }
  pIVar11[(int)uVar10].ID = (ImGuiID)_hovered;
  pIVar11[(int)uVar10].Flags = (ImGuiTabItemFlags)fStack_74;
  pIVar11[(int)uVar10].LastFrameVisible = -1;
  pIVar11[(int)uVar10].LastFrameSelected = -1;
  pIVar11[(int)uVar10].Offset = bb.Min.x;
  pIVar11[(int)uVar10].Width = bb.Min.y;
  pIVar11[(int)uVar10].ContentWidth = bb.Max.x;
  pIVar11[(int)uVar10].RequestedWidth = -1.0;
  pIVar20 = pIVar11 + (int)uVar10;
  pIVar20->NameOffset = -1;
  pIVar20->BeginOrder = -1;
  pIVar20->IndexDuringLayout = -1;
  *(float *)&pIVar11[(int)uVar10].WantClose = _held;
  iVar14 = (tab_bar->Tabs).Size;
  (tab_bar->Tabs).Size = iVar14 + 1;
  pIVar11 = (tab_bar->Tabs).Data;
  pIVar20 = pIVar11 + iVar14;
  pIVar11[iVar14].ID = id;
  tab_bar->TabsAddedNew = true;
  pIVar11 = (tab_bar->Tabs).Data;
  uVar21 = (undefined4)CONCAT71((int7)((ulong)p_open >> 8),1);
LAB_002247ac:
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar20 - (int)pIVar11) >> 2) * -0x745d;
  local_38 = pbVar18;
  IVar26 = TabItemCalcSize(local_60,(bool)((byte)flags_00 & 1 | pbVar18 != (bool *)0x0));
  pcVar7 = local_60;
  local_48 = IVar26.x;
  fStack_44 = IVar26.y;
  pIVar20->RequestedWidth = -1.0;
  if (((local_c0->NextItemData).Flags & 1) != 0) {
    local_48 = (local_c0->NextItemData).Width;
    pIVar20->RequestedWidth = local_48;
  }
  if ((char)uVar21 != '\0') {
    fVar2 = 1.0;
    if (1.0 <= local_48) {
      fVar2 = local_48;
    }
    pIVar20->Width = fVar2;
  }
  local_68.x = (float)uVar21;
  pIVar20->ContentWidth = local_48;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  pIVar20->BeginOrder = sVar3;
  iVar14 = local_c0->FrameCount;
  local_4c = 0;
  if ((flags_00 & 1) != 0) {
    local_4c = (uint)((pIVar20->Flags & 1) == 0);
  }
  local_70 = tab_bar->Flags;
  iVar17 = tab_bar->PrevFrameVisible + 1;
  local_6c = pIVar20->LastFrameVisible + 1;
  pIVar20->LastFrameVisible = iVar14;
  pIVar20->Flags = flags_00;
  iVar16 = (tab_bar->TabsNames).Buf.Size;
  iVar15 = iVar16 + -1;
  if (iVar16 == 0) {
    iVar15 = 0;
  }
  pIVar20->NameOffset = iVar15;
  sVar12 = strlen(local_60);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar7,pcVar7 + sVar12 + 1);
  if ((flags_00 >> 0x15 & 1) == 0) {
    if ((((local_6c < iVar14) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0))
       && ((iVar14 <= iVar17 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
    if (((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  uVar23 = (undefined7)((ulong)&tab_bar->TabsNames >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar22 = CONCAT71(uVar23,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar17 < iVar14) && ((tab_bar->Tabs).Size == 1)) {
    uVar22 = CONCAT71(uVar23,(tab_bar->Flags & 2) == 0);
  }
  else {
    uVar22 = 0;
  }
  if ((local_6c < iVar14) && (local_68.x._0_1_ != '\0' || iVar14 <= iVar17)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,8);
    return (bool)((flags_00 >> 0x15 & 1) == 0 & (byte)uVar22);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar20->LastFrameSelected = local_c0->FrameCount;
  }
  uVar10 = pIVar20->Flags;
  fVar2 = pIVar20->Width;
  fVar25 = pIVar20->Offset;
  if ((uVar10 & 0xc0) == 0) {
    fVar25 = (float)(int)(fVar25 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar25 + (tab_bar->BarRect).Min.x;
  local_68 = (local_80->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar26.y = bb.Min.y;
  IVar26.x = bb.Min.x;
  (local_80->DC).CursorPos = IVar26;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = fStack_44 + bb.Min.y;
  local_58 = uVar22;
  if ((uVar10 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_00224a3c;
    fStack_74 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_84 = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_48 = (float)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_00224a3c:
    local_48 = 0.0;
  }
  pIVar6 = local_80;
  pIVar5 = local_c0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_74 = bb.Max.y - bb.Min.y;
  IVar26 = (local_80->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_c0->Style).FramePadding.y);
  (pIVar6->DC).CursorMaxPos = IVar26;
  bVar24 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar24) {
    if (local_48._0_1_ != '\0') {
      PopClipRect();
    }
    (local_80->DC).CursorPos = local_68;
    return (bool)(char)local_58;
  }
  uVar10 = flags_00 & 0x200000;
  uVar8 = ButtonBehavior(&bb,id,&hovered,&held,
                         ((flags_00 & 0x200000) >> 0x11) + (uint)pIVar5->DragDropActive * 0x200 +
                         0x1010);
  if (((bool)uVar8) && ((flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (local_c0->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (iVar14 <= local_6c)) && (bVar24 = IsMouseDragging(0,-1.0), bVar24)) &&
      ((local_c0->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar2 = (local_c0->IO).MouseDelta.x, fVar2 < 0.0 &&
       (pIVar1 = &(local_c0->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar2 && (bb.Max.x < (local_c0->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,pIVar20,(local_c0->IO).MousePos);
  }
  draw_list = local_80->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if ((char)local_58 == '\0') {
      idx = (uint)((local_70 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_70 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar24 = IsItemHovered(0x20);
  if (bVar24) {
    bVar24 = IsMouseClicked(1,false);
    if (bVar24) {
      uVar10 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar24 = IsMouseReleased(1);
      if (!bVar24) goto LAB_00224cdf;
    }
    if (uVar10 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_00224cdf:
  uVar10 = tab_bar->Flags;
  if (local_38 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  uVar4 = flags_00 & 0xfffffffe;
  if ((char)local_4c == '\0') {
    uVar4 = flags_00;
  }
  bVar24 = (bool)(char)local_58;
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar10 >> 1 & 4 | uVar4,tab_bar->FramePadding,local_60,id,close_button_id
             ,(bool)(char)local_58,&just_closed,&text_clipped);
  if ((local_38 != (bool *)0x0) && (just_closed != false)) {
    *local_38 = false;
    TabBarCloseTab(tab_bar,pIVar20);
  }
  if (local_48._0_1_ != '\0') {
    PopClipRect();
  }
  (local_80->DC).CursorPos = local_68;
  if ((((text_clipped == true) && (local_c0->HoveredId == id)) && (held == false)) &&
     ((((tab_bar->Flags & 0x20) == 0 && ((pIVar20->Flags & 0x10) == 0)) &&
      (bVar9 = IsItemHovered(0x800), pcVar7 = local_60, bVar9)))) {
    pcVar13 = FindRenderedTextEnd(local_60,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar13 - (int)pcVar7),pcVar7);
  }
  if ((flags_00 >> 0x15 & 1) == 0) {
    uVar8 = bVar24;
  }
  return (bool)uVar8;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    ImGuiContext& g = *GImGui;
    if (tab_bar->WantLayout)
    {
        ImGuiNextItemData backup_next_item_data = g.NextItemData;
        TabBarLayout(tab_bar);
        g.NextItemData = backup_next_item_data;
    }
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab_bar->TabsAddedNew = tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, (p_open != NULL) || (flags & ImGuiTabItemFlags_UnsavedDocument));
    tab->RequestedWidth = -1.0f;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        size.x = tab->RequestedWidth = g.NextItemData.Width;
    if (tab_is_new)
        tab->Width = ImMax(1.0f, size.x);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool tab_just_unsaved = (flags & ImGuiTabItemFlags_UnsavedDocument) && !(tab->Flags & ImGuiTabItemFlags_UnsavedDocument);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (!is_tab_button)
    {
        if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
            if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
        if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // _SetSelected can only be passed on explicit tab bar
            tab_bar->NextSelectedTabId = id;
    }

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, tab_just_unsaved ? (flags & ~ImGuiTabItemFlags_UnsavedDocument) : flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held)
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            if (IsItemHovered(ImGuiHoveredFlags_DelayNormal))
                SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}